

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O1

char * seekNewline(char *s,size_t len)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  iVar3 = (int)len + -1;
  lVar5 = 0;
  do {
    iVar1 = (int)lVar5;
    if (iVar3 <= iVar1) {
      return (char *)0x0;
    }
    lVar5 = 0;
    do {
      if (s[lVar5 + iVar1] == '\r') {
        iVar2 = iVar1 + (int)lVar5;
        break;
      }
      lVar5 = lVar5 + 1;
      iVar2 = iVar3;
    } while ((long)iVar3 - (long)iVar1 != lVar5);
    if (iVar2 == iVar3) {
      return (char *)0x0;
    }
    lVar4 = (long)iVar2;
    lVar5 = lVar4 + 1;
    if (s[lVar4 + 1] == '\n') {
      return s + lVar4;
    }
  } while( true );
}

Assistant:

static char *seekNewline(char *s, size_t len) {
    int pos = 0;
    int _len = len-1;

    /* Position should be < len-1 because the character at "pos" should be
     * followed by a \n. Note that strchr cannot be used because it doesn't
     * allow to search a limited length and the buffer that is being searched
     * might not have a trailing NULL character. */
    while (pos < _len) {
        while(pos < _len && s[pos] != '\r') pos++;
        if (pos==_len) {
            /* Not found. */
            return NULL;
        } else {
            if (s[pos+1] == '\n') {
                /* Found. */
                return s+pos;
            } else {
                /* Continue searching. */
                pos++;
            }
        }
    }
    return NULL;
}